

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

int lys_set_enabled(lys_module *module)

{
  uint16_t *puVar1;
  ly_ctx *plVar2;
  lys_module *node;
  lys_node *plVar3;
  int iVar4;
  ly_set *mods;
  ly_set *set;
  char *pcVar5;
  ly_set *set_00;
  lys_node *plVar6;
  lys_node *plVar7;
  LY_ERR *pLVar8;
  byte bVar9;
  ushort uVar10;
  LYS_NODE LVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  lys_ident *der;
  ulong uVar16;
  lys_node *leafref;
  bool bVar17;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
LAB_001109c3:
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    if ((module->field_0x40 & 0x40) != 0) {
      plVar2 = module->ctx;
      lVar12 = 0;
      do {
        if ((plVar2->models).list[lVar12] == module) {
          pLVar8 = ly_errno_location();
          *pLVar8 = LY_EINVAL;
          ly_log(LY_LLERR,"Internal module \"%s\" cannot be removed.",module->name);
          goto LAB_001109c3;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 5);
      mods = ly_set_new();
      set = ly_set_new();
      lys_set_enabled_(mods,module);
      if (5 < (plVar2->models).used) {
        lVar12 = 5;
LAB_001106a4:
        do {
          node = (plVar2->models).list[lVar12];
          if (((node->field_0x40 & 0x40) != 0) && (iVar4 = ly_set_contains(set,node), iVar4 == -1))
          {
            uVar13 = (ulong)node->imp_size;
            if (uVar13 != 0) {
              lVar15 = 0;
              do {
                if ((*(byte *)(*(long *)(node->imp->rev + lVar15 + -0x10) + 0x40) & 0x40) != 0)
                goto LAB_00110740;
                lVar15 = lVar15 + 0x38;
              } while (uVar13 * 0x38 - lVar15 != 0);
              if (uVar13 != 0) {
                uVar14 = 0;
                do {
                  if ((ulong)mods->number != 0) {
                    uVar16 = 0;
                    do {
                      if (node->imp[uVar14].module == (lys_module *)(mods->set).s[uVar16]) {
                        node->field_0x40 = node->field_0x40 & 0xbf;
                        ly_set_add(mods,node,0);
                        lVar12 = 5;
                        if (5 < (plVar2->models).used) goto LAB_001106a4;
                        goto LAB_0011077b;
                      }
                      uVar16 = uVar16 + 1;
                    } while (mods->number != uVar16);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar13);
              }
            }
            ly_set_add(set,node,0);
          }
LAB_00110740:
          lVar12 = lVar12 + 1;
        } while (lVar12 < (plVar2->models).used);
      }
LAB_0011077b:
      if (mods->number != 0) {
        uVar13 = 0;
        do {
          plVar3 = (mods->set).s[uVar13];
          uVar10 = *(ushort *)((long)&plVar3->parent + 4);
          if (uVar10 != 0) {
            pcVar5 = plVar3[1].dsc;
            uVar14 = 0;
            do {
              if (pcVar5[uVar14 * 0x48 + 0x1f] != '\0') {
                der = (lys_ident *)(pcVar5 + uVar14 * 0x48);
                uVar16 = 0;
                do {
                  resolve_identity_backlink_update(der,der->base[uVar16]);
                  uVar16 = uVar16 + 1;
                  pcVar5 = plVar3[1].dsc;
                  der = (lys_ident *)(pcVar5 + uVar14 * 0x48);
                } while (uVar16 < der->base_size);
                uVar10 = *(ushort *)((long)&plVar3->parent + 4);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < uVar10);
          }
          bVar9 = *(byte *)((long)&plVar3->parent + 7);
          if (bVar9 != 0) {
            pcVar5 = plVar3[1].ref;
            uVar14 = 0;
            do {
              lVar12 = uVar14 * 0x40;
              if (pcVar5[lVar12 + 0x1b] != '\0') {
                uVar16 = 0;
                do {
                  resolve_iffeature_getsizes
                            ((lys_iffeature *)(*(long *)(pcVar5 + lVar12 + 0x28) + uVar16 * 0x20),
                             (uint *)0x0,local_34);
                  while (bVar17 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar17) {
                    pcVar5 = plVar3[1].ref;
                    lVar15 = *(long *)(*(long *)(*(long *)(pcVar5 + lVar12 + 0x28) + 0x10 +
                                                uVar16 * 0x20) + (ulong)local_34[0] * 8);
                    set_00 = *(ly_set **)(lVar15 + 0x38);
                    if (set_00 == (ly_set *)0x0) {
                      set_00 = ly_set_new();
                      *(ly_set **)(lVar15 + 0x38) = set_00;
                      pcVar5 = plVar3[1].ref;
                    }
                    ly_set_add(set_00,pcVar5 + lVar12,1);
                  }
                  uVar16 = uVar16 + 1;
                  pcVar5 = plVar3[1].ref;
                } while (uVar16 < (byte)pcVar5[lVar12 + 0x1b]);
                bVar9 = *(byte *)((long)&plVar3->parent + 7);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < bVar9);
          }
          plVar6 = *(lys_node **)&plVar3[1].nodetype;
          if (*(lys_node **)&plVar3[1].nodetype != (lys_node *)0x0) {
            while( true ) {
              do {
                leafref = plVar6;
                LVar11 = leafref->nodetype;
                if (((LVar11 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                   (iVar4._0_2_ = leafref[1].flags, iVar4._2_1_ = leafref[1].ext_size,
                   iVar4._3_1_ = leafref[1].iffeature_size, iVar4 == 9)) {
                  lys_leaf_add_leafref_target((lys_node_leaf *)leafref[1].parent,leafref);
                  LVar11 = leafref->nodetype;
                }
                plVar6 = leafref->child;
              } while (leafref->child != (lys_node *)0x0 &&
                       (LVar11 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN);
              if (leafref == *(lys_node **)&plVar3[1].nodetype) break;
              while (plVar6 = leafref->next, leafref->next == (lys_node *)0x0) {
                leafref = leafref->parent;
                if (leafref->nodetype == LYS_AUGMENT) {
                  leafref = leafref->prev;
                }
                plVar6 = lys_parent(leafref);
                plVar7 = lys_parent(*(lys_node **)&plVar3[1].nodetype);
                if (plVar6 == plVar7) goto LAB_00110943;
              }
            }
          }
LAB_00110943:
          uVar13 = uVar13 + 1;
        } while (uVar13 < mods->number);
        if (mods->number != 0) {
          uVar13 = 0;
          do {
            lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar13]);
            uVar13 = uVar13 + 1;
          } while (uVar13 < mods->number);
        }
      }
      ly_set_free(mods);
      ly_set_free(set);
      puVar1 = &(plVar2->models).module_set_id;
      *puVar1 = *puVar1 + 1;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = INTERNAL_MODULES_COUNT; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}